

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_tec(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_GEOM ref_geom;
  uint uVar2;
  uint uVar3;
  FILE *__s;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  int iVar7;
  char *pcVar8;
  REF_INT edgeid;
  int iVar9;
  long lVar10;
  REF_INT *edge_faces;
  ulong local_40;
  long local_38;
  
  ref_geom = ref_grid->geom;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xdf6,
           "ref_geom_tec","unable to open file");
    return 2;
  }
  fwrite("title=\"refine cad coupling in tecplot format\"\n",0x2e,1,__s);
  fwrite("variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n",0x32,1,__s);
  uVar4 = 0;
  uVar5 = (ulong)(uint)ref_geom->max;
  if (ref_geom->max < 1) {
    uVar5 = uVar4;
  }
  iVar9 = 0x7fffffff;
  iVar7 = -0x80000000;
  for (; iVar1 = iVar9, uVar5 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    if (*(int *)((long)ref_geom->descr + uVar4) == 1) {
      iVar1 = *(int *)((long)ref_geom->descr + uVar4 + 4);
      if (iVar1 <= iVar9) {
        iVar9 = iVar1;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
    }
  }
  do {
    if (iVar7 < iVar1) {
      if (ref_geom->model == (void *)0x0) goto LAB_00168796;
      uVar2 = ref_egads_edge_faces(ref_geom,&edge_faces);
      if (uVar2 != 0) {
        uVar5 = (ulong)uVar2;
        pcVar8 = "edge faces";
        uVar6 = 0xe08;
        goto LAB_00168823;
      }
      lVar10 = (long)iVar9;
      local_38 = (long)iVar7;
      uVar2 = iVar9 * 2 - 1;
      goto LAB_001686ce;
    }
    uVar2 = ref_geom_edge_tec_zone(ref_grid,iVar1,(FILE *)__s);
    iVar1 = iVar1 + 1;
  } while (uVar2 == 0);
  uVar5 = (ulong)uVar2;
  pcVar8 = "tec edge";
  uVar6 = 0xe05;
LAB_00168823:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
         "ref_geom_tec",uVar5,pcVar8);
  return (REF_STATUS)uVar5;
LAB_001686ce:
  if (local_38 < lVar10) goto LAB_00168791;
  iVar9 = edge_faces[(int)(uVar2 - 1)];
  iVar7 = edge_faces[(int)uVar2];
  edgeid = (REF_INT)lVar10;
  if (iVar9 == iVar7) {
    local_40 = (ulong)uVar2;
    uVar3 = ref_geom_pcrv_tec_zone(ref_grid,edgeid,iVar9,1,(FILE *)__s);
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar8 = "tec pcrv";
      uVar6 = 0xe0e;
      goto LAB_00168823;
    }
    uVar3 = ref_geom_pcrv_tec_zone(ref_grid,edgeid,edge_faces[(int)uVar2],-1,(FILE *)__s);
    uVar2 = (uint)local_40;
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar8 = "tec pcrv";
      uVar6 = 0xe11;
      goto LAB_00168823;
    }
  }
  else {
    if (iVar9 != -1) {
      uVar3 = ref_geom_pcrv_tec_zone(ref_grid,edgeid,iVar9,0,(FILE *)__s);
      if (uVar3 != 0) {
        uVar5 = (ulong)uVar3;
        pcVar8 = "tec pcrv";
        uVar6 = 0xe16;
        goto LAB_00168823;
      }
      iVar7 = edge_faces[(int)uVar2];
    }
    if ((iVar7 != -1) &&
       (uVar3 = ref_geom_pcrv_tec_zone(ref_grid,edgeid,iVar7,0,(FILE *)__s), uVar3 != 0)) {
      uVar5 = (ulong)uVar3;
      pcVar8 = "tec pcrv";
      uVar6 = 0xe1a;
      goto LAB_00168823;
    }
  }
  lVar10 = lVar10 + 1;
  uVar2 = uVar2 + 2;
  goto LAB_001686ce;
LAB_00168791:
  free(edge_faces);
LAB_00168796:
  uVar4 = 0;
  uVar5 = (ulong)(uint)ref_geom->max;
  if (ref_geom->max < 1) {
    uVar5 = uVar4;
  }
  iVar9 = 0x7fffffff;
  iVar7 = -0x80000000;
  for (; uVar5 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    if (*(int *)((long)ref_geom->descr + uVar4) == 2) {
      iVar1 = *(int *)((long)ref_geom->descr + uVar4 + 4);
      if (iVar1 <= iVar9) {
        iVar9 = iVar1;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
    }
  }
  do {
    if (iVar7 < iVar9) {
      fclose(__s);
      return 0;
    }
    uVar2 = ref_geom_face_tec_zone(ref_grid,iVar9,(FILE *)__s);
    iVar9 = iVar9 + 1;
  } while (uVar2 == 0);
  uVar5 = (ulong)uVar2;
  pcVar8 = "tec face";
  uVar6 = 0xe28;
  goto LAB_00168823;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;
  REF_INT *edge_faces;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_edge_tec_zone(ref_grid, id, file), "tec edge");

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_edge_faces(ref_geom, &edge_faces), "edge faces");
    for (id = min_id; id <= max_id; id++) {
      if (edge_faces[0 + 2 * (id - 1)] ==
          edge_faces[1 + 2 * (id - 1)]) { /* edge used twice by face */
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                   1, file),
            "tec pcrv");
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                   -1, file),
            "tec pcrv");
      } else { /* edge used by two faces */
        if (REF_EMPTY != edge_faces[0 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
        if (REF_EMPTY != edge_faces[1 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
      }
    }
    ref_free(edge_faces);
  }

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_face_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}